

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
* __thiscall
Js::JavascriptSet::
CreateVarSetFromList<JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
          (JavascriptSet *this,uint initialCapacity)

{
  bool bVar1;
  Recycler *pRVar2;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  void **key;
  MapOrSetDataNode<void_*> **value;
  undefined1 local_70 [16];
  Iterator iter;
  TrackAllocData local_48;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_20;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *varSet;
  JavascriptSet *pJStack_10;
  uint initialCapacity_local;
  JavascriptSet *this_local;
  
  varSet._4_4_ = initialCapacity;
  pJStack_10 = this;
  pRVar2 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,
             (type_info *)
             &JsUtil::
              BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
             ,0x113);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_48);
  iter.current.ptr = (MapOrSetDataNode<void_*> *)Memory::Recycler::AllocInlined;
  pBVar3 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::Recycler>(0x38,pRVar2,0x43c4b0);
  pRVar2 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  JsUtil::
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar3,pRVar2,varSet._4_4_);
  local_20 = pBVar3;
  MapOrSetDataList<void_*>::GetIterator((MapOrSetDataList<void_*> *)(local_70 + 8));
  while( true ) {
    bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)(local_70 + 8));
    pBVar3 = local_20;
    if (!bVar1) break;
    key = MapOrSetDataList<void_*>::Iterator::Current((Iterator *)(local_70 + 8));
    MapOrSetDataList<void_*>::Iterator::CurrentNode((Iterator *)local_70);
    value = Memory::WriteBarrierPtr::operator_cast_to_MapOrSetDataNode__
                      ((WriteBarrierPtr *)local_70);
    JsUtil::
    BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(pBVar3,key,value);
  }
  return local_20;
}

Assistant:

T*
JavascriptSet::CreateVarSetFromList(uint initialCapacity)
{
    T* varSet = RecyclerNew(this->GetRecycler(), T, this->GetRecycler(), initialCapacity);

    JavascriptSet::SetDataList::Iterator iter = this->list.GetIterator();
    // TODO: we can use a more efficient Iterator, since we know there will be no side effects
    while (iter.Next())
    {
        varSet->Add(iter.Current(), iter.CurrentNode());
    }
    return varSet;
}